

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

bool __thiscall
QAbstractItemView::isPersistentEditorOpen(QAbstractItemView *this,QModelIndex *index)

{
  Data *pDVar1;
  QEditorInfo *pQVar2;
  bool bVar3;
  
  pQVar2 = QAbstractItemViewPrivate::editorForIndex(*(QAbstractItemViewPrivate **)(this + 8),index);
  pDVar1 = (pQVar2->widget).wp.d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    bVar3 = false;
  }
  else {
    bVar3 = (pQVar2->widget).wp.value != (QObject *)0x0;
  }
  return bVar3;
}

Assistant:

bool QAbstractItemView::isPersistentEditorOpen(const QModelIndex &index) const
{
    Q_D(const QAbstractItemView);
    return d->editorForIndex(index).widget;
}